

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_http.hpp
# Opt level: O2

void __thiscall
SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::ServerBase
          (ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *this,
          unsigned_short port)

{
  _Rb_tree_header *p_Var1;
  unordered_set<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*,_std::hash<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>,_std::equal_to<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>,_std::allocator<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>_>
  *__p;
  mutex *__p_00;
  ScopeRunner *__p_01;
  
  this->_vptr_ServerBase = (_func_int **)&PTR__ServerBase_0019e218;
  Config::Config(&this->config,port);
  p_Var1 = &(this->resource)._M_t._M_impl.super__Rb_tree_header;
  (this->resource)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->resource)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->resource)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->resource)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->resource)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->default_resource)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->default_resource)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->default_resource)._M_t._M_impl.super__Rb_tree_header;
  (this->default_resource)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->default_resource)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->default_resource)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->on_error).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->on_error).super__Function_base._M_functor + 8) = 0;
  (this->on_error).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->on_error)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->on_upgrade).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->on_upgrade).super__Function_base._M_functor + 8) = 0;
  (this->on_upgrade).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->on_upgrade)._M_invoker = (_Invoker_type)0x0;
  (this->io_service).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  *(undefined8 *)
   ((long)&(this->io_service).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr + 1) = 0;
  *(undefined8 *)
   ((long)&(this->io_service).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 1) = 0;
  (this->acceptor)._M_t.
  super___uniq_ptr_impl<asio::basic_socket_acceptor<asio::ip::tcp>,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
  .super__Head_base<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_false>._M_head_impl =
       (basic_socket_acceptor<asio::ip::tcp> *)0x0;
  (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __p = (unordered_set<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*,_std::hash<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>,_std::equal_to<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>,_std::allocator<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>_>
         *)operator_new(0x38);
  *(undefined8 *)&(__p->_M_h)._M_rehash_policy = 0;
  (__p->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__p->_M_h)._M_buckets = &(__p->_M_h)._M_single_bucket;
  (__p->_M_h)._M_bucket_count = 1;
  (__p->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__p->_M_h)._M_element_count = 0;
  (__p->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__p->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__p->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  std::
  __shared_ptr<std::unordered_set<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Connection*,std::hash<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Connection*>,std::equal_to<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Connection*>,std::allocator<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Connection*>>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<std::unordered_set<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Connection*,std::hash<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Connection*>,std::equal_to<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Connection*>,std::allocator<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Connection*>>,void>
            ((__shared_ptr<std::unordered_set<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Connection*,std::hash<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Connection*>,std::equal_to<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Connection*>,std::allocator<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Connection*>>,(__gnu_cxx::_Lock_policy)2>
              *)&this->connections,__p);
  __p_00 = (mutex *)operator_new(0x28);
  *(undefined8 *)((long)&(__p_00->super___mutex_base)._M_mutex + 0x10) = 0;
  (__p_00->super___mutex_base)._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (__p_00->super___mutex_base)._M_mutex.__align = 0;
  *(undefined8 *)((long)&(__p_00->super___mutex_base)._M_mutex + 8) = 0;
  (__p_00->super___mutex_base)._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::__shared_ptr<std::mutex,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<std::mutex,void>
            ((__shared_ptr<std::mutex,(__gnu_cxx::_Lock_policy)2> *)&this->connections_mutex,__p_00)
  ;
  __p_01 = (ScopeRunner *)operator_new(8);
  (__p_01->count).super___atomic_base<long>._M_i = 0;
  std::__shared_ptr<SimpleWeb::ScopeRunner,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<SimpleWeb::ScopeRunner,void>
            ((__shared_ptr<SimpleWeb::ScopeRunner,(__gnu_cxx::_Lock_policy)2> *)
             &this->handler_runner,__p_01);
  return;
}

Assistant:

ServerBase(unsigned short port) noexcept : config(port), connections(new std::unordered_set<Connection *>()), connections_mutex(new std::mutex()), handler_runner(new ScopeRunner()) {}